

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseMessage.cpp
# Opt level: O2

bool __thiscall
SGParser::Generator::ParseMessageBuffer::PrintMessages
          (ParseMessageBuffer *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *stringBuffer,uint flags)

{
  pointer pPVar1;
  uint in_ECX;
  String *this_00;
  pointer source;
  undefined1 local_58 [8];
  String msg;
  
  msg.field_2._8_8_ = this->pMessages;
  if ((Messages *)msg.field_2._8_8_ != (Messages *)0x0) {
    this_00 = (String *)stringBuffer;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(stringBuffer);
    pPVar1 = (this->pMessages->
             super__Vector_base<SGParser::Generator::ParseMessage,_std::allocator<SGParser::Generator::ParseMessage>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (source = (this->pMessages->
                  super__Vector_base<SGParser::Generator::ParseMessage,_std::allocator<SGParser::Generator::ParseMessage>_>
                  )._M_impl.super__Vector_impl_data._M_start; source != pPVar1; source = source + 1)
    {
      msg._M_dataplus._M_p = (pointer)0x0;
      msg._M_string_length._0_1_ = 0;
      local_58 = (undefined1  [8])&msg._M_string_length;
      PrintMessage((ParseMessageBuffer *)this_00,(String *)local_58,source,in_ECX);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(stringBuffer,(String *)local_58);
      this_00 = (String *)local_58;
      std::__cxx11::string::~string((string *)local_58);
    }
  }
  return msg.field_2._8_8_ != 0;
}

Assistant:

bool ParseMessageBuffer::PrintMessages(std::vector<String>& stringBuffer,
                                       [[maybe_unused]] unsigned flags) const {
    // Make sure we have a valid message buffer
    if (!pMessages)
        return false;

    stringBuffer.clear();

    // Build the list of message strings
    for (const auto& message: *pMessages) {
        String msg;
        PrintMessage(msg, message, 0u);
        stringBuffer.push_back(msg);
    }

    return true;
}